

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::remove_edge(Graph *this,vertex_t s,vertex_t t)

{
  uint *puVar1;
  pointer *ppuVar2;
  pointer pvVar3;
  uint *puVar4;
  pointer puVar5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var6
  ;
  ulong uVar7;
  ulong uVar8;
  vertex_t local_20;
  vertex_t local_1c;
  
  uVar8 = (ulong)s;
  pvVar3 = (this->succ_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->succ_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
          -0x5555555555555555;
  local_20 = t;
  local_1c = s;
  if (uVar8 <= uVar7 && uVar7 - uVar8 != 0) {
    pvVar3 = pvVar3 + uVar8;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                      (*(undefined8 *)
                        &(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl,
                       *(pointer *)
                        ((long)&(pvVar3->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl + 8),&local_20);
    puVar1 = _Var6._M_current + 1;
    puVar4 = *(pointer *)
              ((long)&(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl + 8);
    if (puVar1 != puVar4) {
      memmove(_Var6._M_current,puVar1,(long)puVar4 - (long)puVar1);
    }
    ppuVar2 = (pointer *)
              ((long)&(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl + 8);
    *ppuVar2 = *ppuVar2 + -1;
    uVar8 = (ulong)local_20;
    pvVar3 = (this->pred_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(this->pred_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
            -0x5555555555555555;
    if (uVar8 <= uVar7 && uVar7 - uVar8 != 0) {
      pvVar3 = pvVar3 + uVar8;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        ((pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                         *(pointer *)
                          ((long)&(pvVar3->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data + 8),&local_1c);
      puVar1 = _Var6._M_current + 1;
      puVar4 = *(pointer *)
                ((long)&(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data + 8);
      if (puVar1 != puVar4) {
        memmove(_Var6._M_current,puVar1,(long)puVar4 - (long)puVar1);
      }
      ppuVar2 = (pointer *)
                ((long)&(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data + 8);
      *ppuVar2 = *ppuVar2 + -1;
      puVar5 = (this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (long)(this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2;
      if (local_1c < uVar7) {
        puVar5[local_1c] = puVar5[local_1c] - 1;
        if (local_20 < uVar7) {
          puVar5[local_20] = puVar5[local_20] - 1;
          return;
        }
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void Graph::remove_edge(vertex_t s, vertex_t t) {
    // TODO check existence
    succ_.at(s).erase(find(succ_.at(s).begin(), succ_.at(s).end(), t));
    pred_.at(t).erase(find(pred_.at(t).begin(), pred_.at(t).end(), s));

    --deg_.at(s);
    --deg_.at(t);
}